

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_1::RecoverFromResetCase::iterate(RecoverFromResetCase *this)

{
  TestLog *log_00;
  MessageBuilder *pMVar1;
  InfiniteLoop *this_00;
  ShaderType *pSVar2;
  ContextReset *pCVar3;
  Error *anon_var_0;
  undefined1 local_2320 [8];
  RenderingContext contextB;
  int reset_status;
  int timeout;
  int sleepTimeMs;
  GLint status;
  Error *error;
  undefined1 local_1dc8 [8];
  UniquePtr<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
  contextReset;
  Functions gl;
  undefined1 local_388 [8];
  RenderingContext contextA;
  EGLint aEStack_1d8 [2];
  EGLint attribList [9];
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  RecoverFromResetCase *this_local;
  
  log = (TestLog *)this;
  local_20 = tcu::TestContext::getLog
                       ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_1a0,
                      (char (*) [89])
                      "Provoke a context reset and wait for glGetGraphicsResetStatus() to return NO_ERROR_KHR.\n"
                     );
  pMVar1 = tcu::MessageBuilder::operator<<
                     (pMVar1,(char (*) [65])
                             "Destroy the old context and successfully create a new context.\n\n");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  attribList[2] = 0x30bf;
  attribList[3] = 1;
  attribList[4] = 0x3138;
  attribList[5] = 0x31bf;
  aEStack_1d8[0] = 0x3098;
  aEStack_1d8[1] = 3;
  attribList[0] = 0x30fb;
  attribList[1] = 1;
  attribList[6] = 0x3038;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,aEStack_1d8);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&contextA.m_context,local_20,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&contextA.m_context,(char (*) [17])"Create context A");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&contextA.m_context);
  gl.waitSync = (glWaitSyncFunc)0x0;
  RenderingContext::RenderingContext
            ((RenderingContext *)local_388,
             (this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,aEStack_1d8,
             &(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,&gl.waitSync);
  RenderingContext::makeCurrent
            ((RenderingContext *)local_388,&(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions
            ((Functions *)
             &contextReset.
              super_UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
              .m_data.field_0x8);
  RenderingContext::initGLFunctions
            ((RenderingContext *)local_388,
             (Functions *)
             &contextReset.
              super_UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
              .m_data.field_0x8);
  checkRequiredGLRobustnessExtension
            (aEStack_1d8,
             (Functions *)
             &contextReset.
              super_UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
              .m_data.field_0x8);
  this_00 = (InfiniteLoop *)operator_new(0x48);
  log_00 = local_20;
  pSVar2 = RobustnessTestCase::Params::getShaderType(&(this->super_RobustnessTestCase).m_params);
  InfiniteLoop::InfiniteLoop
            (this_00,(Functions *)
                     &contextReset.
                      super_UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
                      .m_data.field_0x8,log_00,*pSVar2);
  de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>::DefaultDeleter
            ((DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset> *)((long)&error + 7));
  de::details::
  UniquePtr<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
  ::UniquePtr((UniquePtr<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
               *)local_1dc8,this_00);
  pCVar3 = de::details::
           UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
           ::operator->((UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
                         *)local_1dc8);
  (*pCVar3->_vptr_ContextReset[2])();
  pCVar3 = de::details::
           UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
           ::operator->((UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
                         *)local_1dc8);
  (*pCVar3->_vptr_ContextReset[3])();
  pCVar3 = de::details::
           UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
           ::operator->((UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
                         *)local_1dc8);
  (*pCVar3->_vptr_ContextReset[4])();
  pCVar3 = de::details::
           UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
           ::operator->((UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
                         *)local_1dc8);
  ContextReset::finish(pCVar3);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&contextB.m_context,local_20,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&contextB.m_context,(char (*) [17])"Create context B");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&contextB.m_context);
  anon_var_0 = (Error *)0x0;
  RenderingContext::RenderingContext
            ((RenderingContext *)local_2320,
             (this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,aEStack_1d8,
             &(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,&anon_var_0);
  RenderingContext::~RenderingContext((RenderingContext *)local_2320);
  tcu::TestContext::setTestResult
            ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             ,QP_TEST_RESULT_PASS,"Pass");
  this_local._4_4_ = STOP;
  de::details::
  UniquePtr<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
  ::~UniquePtr((UniquePtr<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
                *)local_1dc8);
  RenderingContext::~RenderingContext((RenderingContext *)local_388);
  return this_local._4_4_;
}

Assistant:

TestCase::IterateResult	iterate	(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "Provoke a context reset and wait for glGetGraphicsResetStatus() to return NO_ERROR_KHR.\n"
			<< "Destroy the old context and successfully create a new context.\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribList[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribList);

		log << tcu::TestLog::Message << "Create context A" << tcu::TestLog::EndMessage;
		RenderingContext contextA(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		contextA.makeCurrent(m_eglSurface);

		glw::Functions gl;
		contextA.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribList, gl);

		DE_ASSERT(m_params.getContextResetType() == CONTEXTRESETTYPE_INFINITE_LOOP);
		de::UniquePtr<ContextReset> contextReset(new InfiniteLoop(gl, log, m_params.getShaderType()));

		contextReset->setup();
		contextReset->draw();

		try
		{
			contextReset->teardown();
			contextReset->finish();
		}
		catch (const glu::Error& error)
		{
			if (error.getError() == GL_CONTEXT_LOST)
			{
				const glw::GLint status = gl.getGraphicsResetStatus();
				if (status == GL_NO_ERROR)
				{
					log << tcu::TestLog::Message
						<< "Test failed! glGetGraphicsResetStatus() returned wrong value [" << glu::getErrorStr(status) << ", expected " << glu::getErrorStr(GL_GUILTY_CONTEXT_RESET) << "]"
						<< tcu::TestLog::EndMessage;

					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				}

				const int	sleepTimeMs		= 1000;				// (1 second)
				int			timeout			= sleepTimeMs * 10; // (10 seconds)
				int			reset_status	= -1;

				// wait for context to reset
				while ((reset_status = gl.getGraphicsResetStatus() != GL_NO_ERROR) && timeout > 0)
				{
					deSleep(sleepTimeMs);
					timeout -= sleepTimeMs;
				}

				if (reset_status != GL_NO_ERROR)
				{
					log	<< tcu::TestLog::Message
						<< "Test failed! Context did not reset. glGetGraphicsResetStatus() returned wrong value [" << glu::getErrorStr(reset_status) << ", expected " << glu::getErrorStr(GL_NO_ERROR) << "]"
						<< tcu::TestLog::EndMessage;

					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				}
			}
			else
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Test failed! glGetError() returned wrong value. Expected GL_CONTEXT_LOST in context A");
				return STOP;
			}
		}

		try
		{
			log << tcu::TestLog::Message << "Create context B" << tcu::TestLog::EndMessage;
			RenderingContext contextB(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		}
		catch (const glu::Error&)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Test failed! Could not create new context. glGetError() returned wrong value. Expected GL_NO_ERROR");
			return STOP;
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}